

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::SetNeighbourInfo
          (TPZGeoBlend<pzgeom::TPZGeoPrism> *this,int side,TPZGeoElSide *neigh,
          TPZTransform<double> *trans)

{
  int64_t iVar1;
  TPZGeoElSideIndex *in_RCX;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> *t;
  TPZSavable in_stack_ffffffffffffffd8;
  
  iVar1 = TPZGeoElSideIndex::ElementIndex
                    ((TPZGeoElSideIndex *)
                     ((in_RDI->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                     (long)(in_ESI + -6) * 6 + -10));
  if (iVar1 == -1) {
    t = (TPZTransform<double> *)&stack0xffffffffffffffc8;
    TPZGeoElSideIndex::TPZGeoElSideIndex
              (in_RCX,(TPZGeoElSide *)in_stack_ffffffffffffffd8._vptr_TPZSavable);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)
               ((in_RDI->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
               (long)(in_ESI + -6) * 6 + -10),(TPZGeoElSideIndex *)t);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1647d14);
    TPZTransform<double>::operator=(in_RDI,t);
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::SetNeighbourInfo(int side, TPZGeoElSide &neigh, TPZTransform<> &trans)
{
	if(!(fNeighbours[side-TGeo::NNodes].ElementIndex() != -1))
	{
		fNeighbours[side-TGeo::NNodes] = neigh;
		fTrans[side - TGeo::NNodes] = trans;
	}
	else
	{
#ifdef PZ_LOG
        if(logger.isWarnEnabled())
        {
        
            std::stringstream mess;
            mess << "Trying to SetNeighbourInfo for an already set element\n";
            mess << "* this * = " << __PRETTY_FUNCTION__ << "\n";
            this->Print(mess);
            mess << "* neigh * = \n";
            neigh.Element()->Print(mess);
            LOGPZ_WARN(logger,mess.str());
        }
#endif
	}
}